

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::StringOption::StringOption
          (StringOption *this,char *c,char *n,char *d,char *def,bool tunable,Option *dependOn)

{
  Option *pOVar1;
  Option *in_RDI;
  char *in_R8;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *pcVar2;
  char *in_stack_ffffffffffffff88;
  allocator *paVar3;
  char *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string *this_00;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  byte bVar4;
  allocator in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  
  Option::Option(in_RDI,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0),
                 (Option *)
                 CONCAT17(in_stack_ffffffffffffffb7,
                          CONCAT16(in_stack_ffffffffffffffb6,
                                   CONCAT15(in_stack_ffffffffffffffb5,in_stack_ffffffffffffffb0))));
  in_RDI->_vptr_Option = (_func_int **)&PTR__StringOption_0011ecf0;
  pOVar1 = in_RDI + 1;
  bVar4 = 0;
  if (in_R8 == (char *)0x0) {
    this_00 = (string *)0x0;
  }
  else {
    this_00 = (string *)operator_new(0x20);
    paVar3 = (allocator *)&stack0xffffffffffffffb6;
    pcVar2 = in_R8;
    std::allocator<char>::allocator();
    bVar4 = 1;
    std::__cxx11::string::string(this_00,pcVar2,paVar3);
  }
  if ((bVar4 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb6);
  }
  pOVar1->_vptr_Option = (_func_int **)this_00;
  in_RDI[1].name = in_R8;
  return;
}

Assistant:

StringOption(const char *c, const char *n, const char *d, const char *def = NULL, bool tunable = false, Option *dependOn = 0)
      : Option(n, d, c, "<std::string>", tunable, dependOn), value(def == NULL ? NULL : new std::string(def)), defaultValue(def)
    {
    }